

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::CharSet<char16_t>::SetRange
          (CharSet<char16_t> *this,ArenaAllocator *allocator,Char lc,Char hc)

{
  CharBitvec *this_00;
  uint8 *puVar1;
  CharSetNode *pCVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  size_t sVar8;
  CharSetInner *this_01;
  undefined4 extraout_var;
  byte bVar9;
  undefined6 in_register_0000000a;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  undefined6 in_register_00000012;
  uint value;
  ulong uVar13;
  undefined **ppuVar14;
  uint i;
  uint uVar15;
  
  uVar10 = CONCAT62(in_register_0000000a,hc);
  uVar13 = CONCAT62(in_register_00000012,lc) & 0xffffffff;
  if ((ushort)(Char)uVar13 <= (ushort)hc) {
    uVar12 = (uint)uVar10;
    uVar11 = uVar10;
    if ((this->rep).compact.countPlusOne - 1 < 5) {
      if (uVar12 - (int)CONCAT62(in_register_00000012,lc) < 4) {
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          uVar15 = 0;
          while( true ) {
            sVar8 = (this->rep).compact.countPlusOne;
            if (4 < sVar8 - 1) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                 ,0x1ef,"(IsCompact())","IsCompact()");
              if (!bVar4) goto LAB_00e59e03;
              *puVar7 = 0;
              sVar8 = (this->rep).compact.countPlusOne;
            }
            value = (uint)uVar13;
            if ((int)sVar8 - 1U <= uVar15) goto LAB_00e59b8e;
            if ((uVar15 < 4) && (uVar5 = GetCompactCharU(this,uVar15), uVar5 == value)) break;
            uVar15 = uVar15 + 1;
          }
          sVar8 = (this->rep).compact.countPlusOne;
LAB_00e59b8e:
          if (4 < sVar8 - 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x1ef,"(IsCompact())","IsCompact()");
            if (!bVar4) goto LAB_00e59e03;
            *puVar7 = 0;
            sVar8 = (this->rep).compact.countPlusOne;
          }
          if (uVar15 - (int)sVar8 == -1) {
            if (3 < uVar15) {
              if (uVar12 < value) {
                return;
              }
              break;
            }
            AddCompactCharU(this,value);
          }
          uVar13 = (ulong)(value + 1);
          if (value == uVar12) {
            return;
          }
        } while( true );
      }
      SwitchRepresentations(this,allocator);
      if ((this->rep).compact.countPlusOne - 1 < 5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,1099,"(!IsCompact())","!IsCompact()");
        if (!bVar4) {
LAB_00e59e03:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      uVar11 = uVar10 & 0xffffffff;
    }
    uVar15 = (uint)uVar13;
    if ((short)uVar11 == -1 && uVar15 == 0) {
      (this->rep).full.direct.vec[4] = 0xffffffff;
      (this->rep).full.direct.vec[5] = 0xffffffff;
      (this->rep).full.direct.vec[6] = 0xffffffff;
      (this->rep).full.direct.vec[7] = 0xffffffff;
      (this->rep).compact.cs[0] = 0xffffffff;
      (this->rep).compact.cs[1] = 0xffffffff;
      (this->rep).compact.cs[2] = 0xffffffff;
      (this->rep).compact.cs[3] = 0xffffffff;
      pCVar2 = (this->rep).full.root;
      ppuVar14 = &CharSetFull::Instance;
      if (pCVar2 != (CharSetNode *)0x0) {
        (**pCVar2->_vptr_CharSetNode)(pCVar2,allocator);
      }
    }
    else {
      if (uVar15 < 0x100) {
        this_00 = &(this->rep).full.direct;
        if ((uVar12 & 0xffff) < 0x100) {
          CharBitvec::SetRange(this_00,uVar15,uVar12);
          return;
        }
        if (uVar15 == 0xff) {
          puVar1 = (this->rep).compact.padding + 0xf;
          *puVar1 = *puVar1 | 0x80;
        }
        else {
          uVar11 = uVar13 >> 5;
          bVar9 = (byte)uVar13 & 0x1f;
          if ((int)uVar11 == 7) {
            if ((uVar13 & 0x1f) == 0) {
              uVar12 = 0xffffffff;
            }
            else {
              uVar12 = ~(-1 << (-bVar9 & 0x1f)) << bVar9 | this_00->vec[uVar11];
            }
            this_00->vec[uVar11] = uVar12;
          }
          else {
            if ((uVar13 & 0x1f) == 0) {
              uVar12 = 0xffffffff;
            }
            else {
              uVar12 = ~(-1 << (-bVar9 & 0x1f)) << bVar9 | this_00->vec[uVar11];
            }
            this_00->vec[uVar11] = uVar12;
            if (uVar15 < 0xc0) {
              memset((void *)((long)this_00->vec + (ulong)(uVar15 >> 3 & 0x1c) + 4),0xff,
                     (ulong)((int)uVar11 * -4 + 0x14) + 4);
            }
            (this->rep).full.direct.vec[7] = 0xffffffff;
          }
        }
        uVar13 = 0x100;
      }
      this_01 = (CharSetInner *)(this->rep).full.root;
      if (this_01 == (CharSetInner *)0x0) {
        this_01 = (CharSetInner *)new<Memory::ArenaAllocator>(0x88,allocator,0x364470);
        CharSetInner::CharSetInner(this_01);
        (this->rep).full.root = (CharSetNode *)this_01;
      }
      iVar6 = (*(this_01->super_CharSetNode)._vptr_CharSetNode[2])
                        (this_01,allocator,2,uVar13,uVar10 & 0xffffffff);
      ppuVar14 = (undefined **)CONCAT44(extraout_var,iVar6);
    }
    (this->rep).full.root = (CharSetNode *)ppuVar14;
  }
  return;
}

Assistant:

void CharSet<char16>::SetRange(ArenaAllocator* allocator, Char lc, Char hc)
    {
        uint l = CTU(lc);
        uint h = CTU(hc);
        if (h < l)
            return;

        if (IsCompact())
        {
            if (h - l < MaxCompact)
            {
                do
                {
                    uint i;
                    for (i = 0; i < this->GetCompactLength(); i++)
                    {
                        __assume(l <= MaxUChar);
                        if (l <= MaxUChar && i < MaxCompact)
                        {
                            if (this->GetCompactCharU(i) == l)
                                break;
                        }
                    }
                    if (i == this->GetCompactLength())
                    {
                        // Character not already in compact set
                        if (i < MaxCompact)
                        {
                            this->AddCompactCharU(l);
                        }
                        else
                            // Must switch representations
                            break;
                    }
                    l++;
                }
                while (l <= h);
                if (h < l)
                    // All chars are now in compact set
                    return;
                // else: fall-through to general case for remaining chars
            }
            // else: no use even trying

            SwitchRepresentations(allocator);
        }

        Assert(!IsCompact());

        if (l == 0 && h == MaxUChar)
        {
            rep.full.direct.SetRange(0, CharSetNode::directSize - 1);
            if (rep.full.root != nullptr)
                rep.full.root->FreeSelf(allocator);
            rep.full.root = CharSetFull::TheFullNode;
        }
        else
        {
            if (l < CharSetNode::directSize)
            {
                if (h < CharSetNode::directSize)
                {
                    rep.full.direct.SetRange(l, h);
                    return;
                }
                rep.full.direct.SetRange(l, CharSetNode::directSize - 1);
                l = CharSetNode::directSize;
            }

            if (rep.full.root == nullptr)
                rep.full.root = Anew(allocator, CharSetInner);
            rep.full.root = rep.full.root->Set(allocator, CharSetNode::levels - 1, l, h);
        }
    }